

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

int NULLC::StrNEqual(NULLCArray a,NULLCArray b)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = a.len;
  uVar2 = 1;
  if (uVar3 == b.len) {
    bVar5 = uVar3 == 0;
    if ((!bVar5) && (*a.ptr == *b.ptr)) {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar3 == uVar4) break;
        uVar1 = uVar4 + 1;
      } while (a.ptr[uVar4] == b.ptr[uVar4]);
      bVar5 = uVar3 <= uVar4;
    }
    uVar2 = (uint)(bVar5 ^ 1);
  }
  return uVar2;
}

Assistant:

int NULLC::StrNEqual(NULLCArray a, NULLCArray b)
{
	return !StrEqual(a, b);
}